

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_grid(int slices,float spacing)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  float fVar4;
  float z;
  
  iVar2 = slices / 2;
  _Var1 = rf_gfx_check_buffer_limit(slices << 2);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  z = (float)-iVar2 * spacing;
  for (lVar3 = (long)-iVar2; lVar3 <= iVar2; lVar3 = lVar3 + 1) {
    if (lVar3 == 0) {
      rf_gfx_color3f(0.5,0.5,0.5);
      rf_gfx_color3f(0.5,0.5,0.5);
      rf_gfx_color3f(0.5,0.5,0.5);
      fVar4 = 0.5;
    }
    else {
      rf_gfx_color3f(0.75,0.75,0.75);
      rf_gfx_color3f(0.75,0.75,0.75);
      rf_gfx_color3f(0.75,0.75,0.75);
      fVar4 = 0.75;
    }
    rf_gfx_color3f(fVar4,fVar4,fVar4);
    fVar4 = (float)lVar3 * spacing;
    rf_gfx_vertex3f(fVar4,0.0,z);
    rf_gfx_vertex3f(fVar4,0.0,(float)iVar2 * spacing);
    rf_gfx_vertex3f(z,0.0,fVar4);
    rf_gfx_vertex3f((float)iVar2 * spacing,0.0,fVar4);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_grid(int slices, float spacing)
{
    int half_slices = slices/2;

    if (rf_gfx_check_buffer_limit(slices * 4)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    for (rf_int i = -half_slices; i <= half_slices; i++)
    {
        if (i == 0)
        {
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
        }
        else
        {
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
        }

        rf_gfx_vertex3f((float)i*spacing, 0.0f, (float)-half_slices*spacing);
        rf_gfx_vertex3f((float)i*spacing, 0.0f, (float)half_slices*spacing);

        rf_gfx_vertex3f((float)-half_slices*spacing, 0.0f, (float)i*spacing);
        rf_gfx_vertex3f((float)half_slices*spacing, 0.0f, (float)i*spacing);
    }
    rf_gfx_end();
}